

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assertions.hpp
# Opt level: O0

void rc::detail::
     doAssert<rc::detail::expr::Eq<rc::detail::expr::Value<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (Eq<rc::detail::expr::Value<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *expression,bool expectedResult,Type type,string *file,int line,string *assertion)

{
  ValueType_conflict VVar1;
  CaseResult *this;
  string local_1f8;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream ss;
  string *assertion_local;
  int line_local;
  string *file_local;
  Type type_local;
  bool expectedResult_local;
  Eq<rc::detail::expr::Value<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *expression_local;
  
  VVar1 = expr::
          Eq<rc::detail::expr::Value<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value(expression);
  if (VVar1 != expectedResult) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    expr::
    Eq<rc::detail::expr::Value<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::show(expression,(ostream *)local_1a8);
    this = (CaseResult *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    makeExpressionMessage(&local_1d8,file,line,assertion,&local_1f8);
    CaseResult::CaseResult(this,type,&local_1d8);
    __cxa_throw(this,&CaseResult::typeinfo,CaseResult::~CaseResult);
  }
  return;
}

Assistant:

void doAssert(const Expression &expression,
              bool expectedResult,
              CaseResult::Type type,
              const std::string &file,
              int line,
              const std::string &assertion) {
  if (static_cast<bool>(expression.value()) != expectedResult) {
    std::ostringstream ss;
    expression.show(ss);
    throw CaseResult(type,
                     makeExpressionMessage(file, line, assertion, ss.str()));
  }
}